

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDCImporter::InternReadFile
          (MDCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  uchar *puVar1;
  aiVector3D *vXYZOut;
  aiVector3D *vNorOut;
  BaseVertex *bvert;
  short sVar2;
  uint uVar3;
  uint32_t uVar4;
  uchar *puVar5;
  bool bVar6;
  pointer pbVar7;
  undefined8 uVar8;
  uint i_1;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  aiMesh **ppaVar12;
  ulong uVar13;
  aiMesh *paVar14;
  size_t sVar15;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  ulong *puVar16;
  aiFace *paVar17;
  uint *puVar18;
  Logger *this_00;
  aiNode *paVar19;
  aiNode **ppaVar20;
  aiMaterial **ppaVar21;
  aiMaterial *this_01;
  DeadlyImportError *pDVar22;
  Surface *pcSurf;
  uint i;
  uint uVar23;
  uint i_2;
  char *pcVar24;
  Surface *pSVar25;
  Frame *pFVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  uint local_4ec;
  char *local_4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aszShaders;
  aiColor3D local_4c0;
  long *local_4b0;
  char *local_4a8;
  aiFace *local_4a0;
  int iMode;
  ulong local_490;
  ulong local_488;
  char *local_480;
  Frame *local_478;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  aiString path;
  long *plVar11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,"rb",(allocator<char> *)&mBuffer2);
  iVar9 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,path._0_8_);
  plVar11 = (long *)CONCAT44(extraout_var,iVar9);
  std::__cxx11::string::~string((string *)&path);
  if (plVar11 == (long *)0x0) {
    pDVar22 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mBuffer2,
                   "Failed to open MDC file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mBuffer2,
                   ".");
    DeadlyImportError::DeadlyImportError(pDVar22,(string *)&path);
    __cxa_throw(pDVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_4b0 = plVar11;
  uVar10 = (**(code **)(*plVar11 + 0x30))(plVar11);
  this->fileSize = uVar10;
  if ((uVar10 & 0xfffffff0) < 0x70) {
    pDVar22 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,"MDC File is too small.",(allocator<char> *)&mBuffer2);
    DeadlyImportError::DeadlyImportError(pDVar22,(string *)&path);
    __cxa_throw(pDVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&mBuffer2,(ulong)uVar10,(allocator_type *)&path);
  (**(code **)(*local_4b0 + 0x10))
            (local_4b0,
             mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,1,this->fileSize);
  this->mBuffer =
       mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->pcHeader =
       (Header *)
       mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  ValidateHeader(this);
  aszShaders.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aszShaders.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aszShaders.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar5 = this->mBuffer;
  uVar10 = this->pcHeader->ulOffsetBorderFrames;
  uVar13 = (ulong)this->pcHeader->ulOffsetSurfaces;
  uVar3 = this->configFrameID;
  puVar1 = puVar5 + uVar13;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  pSVar25 = (Surface *)(puVar5 + uVar13);
  puVar1 = puVar5 + uVar13 + 0x43;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar5 + uVar13 + 0x53;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar5 + uVar13 + 99;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar5 + uVar13 + 0x6c;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  uVar27 = 0;
  pcSurf = pSVar25;
  for (uVar23 = 0; uVar23 < this->pcHeader->ulNumSurfaces; uVar23 = uVar23 + 1) {
    ValidateSurfaceHeader(this,pcSurf);
    if ((pcSurf->ulNumVertices != 0) && (pcSurf->ulNumTriangles != 0)) {
      pScene->mNumMeshes = pScene->mNumMeshes + 1;
    }
    uVar27 = uVar27 + pcSurf->ulNumShaders;
    uVar13 = (ulong)pcSurf->ulOffsetEnd;
    pcVar24 = pcSurf->ucName + (uVar13 - 4);
    pcVar24[0] = '\0';
    pcVar24[1] = '\0';
    pcVar24[2] = '\0';
    pcVar24[3] = '\0';
    pcVar24 = pcSurf->ucName + uVar13 + 0x3f;
    pcVar24[0] = '\0';
    pcVar24[1] = '\0';
    pcVar24[2] = '\0';
    pcVar24[3] = '\0';
    pcVar24[4] = '\0';
    pcVar24[5] = '\0';
    pcVar24[6] = '\0';
    pcVar24[7] = '\0';
    pcVar24[8] = '\0';
    pcVar24[9] = '\0';
    pcVar24[10] = '\0';
    pcVar24[0xb] = '\0';
    pcVar24[0xc] = '\0';
    pcVar24[0xd] = '\0';
    pcVar24[0xe] = '\0';
    pcVar24[0xf] = '\0';
    pcVar24 = pcSurf->ucName + uVar13 + 0x4f;
    pcVar24[0] = '\0';
    pcVar24[1] = '\0';
    pcVar24[2] = '\0';
    pcVar24[3] = '\0';
    pcVar24[4] = '\0';
    pcVar24[5] = '\0';
    pcVar24[6] = '\0';
    pcVar24[7] = '\0';
    pcVar24[8] = '\0';
    pcVar24[9] = '\0';
    pcVar24[10] = '\0';
    pcVar24[0xb] = '\0';
    pcVar24[0xc] = '\0';
    pcVar24[0xd] = '\0';
    pcVar24[0xe] = '\0';
    pcVar24[0xf] = '\0';
    pcVar24 = pcSurf->ucName + uVar13 + 0x5f;
    pcVar24[0] = '\0';
    pcVar24[1] = '\0';
    pcVar24[2] = '\0';
    pcVar24[3] = '\0';
    pcVar24[4] = '\0';
    pcVar24[5] = '\0';
    pcVar24[6] = '\0';
    pcVar24[7] = '\0';
    pcVar24[8] = '\0';
    pcVar24[9] = '\0';
    pcVar24[10] = '\0';
    pcVar24[0xb] = '\0';
    pcVar24[0xc] = '\0';
    pcVar24[0xd] = '\0';
    pcVar24[0xe] = '\0';
    pcVar24[0xf] = '\0';
    pcVar24 = pcSurf->ucName + uVar13 + 0x68;
    pcVar24[0] = '\0';
    pcVar24[1] = '\0';
    pcVar24[2] = '\0';
    pcVar24[3] = '\0';
    pcVar24[4] = '\0';
    pcVar24[5] = '\0';
    pcVar24[6] = '\0';
    pcVar24[7] = '\0';
    pcVar24[8] = '\0';
    pcVar24[9] = '\0';
    pcVar24[10] = '\0';
    pcVar24[0xb] = '\0';
    pcVar24[0xc] = '\0';
    pcVar24[0xd] = '\0';
    pcVar24[0xe] = '\0';
    pcVar24[0xf] = '\0';
    pcSurf = (Surface *)(pcSurf->ucName + (uVar13 - 4));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&aszShaders,(ulong)uVar27);
  uVar29 = (ulong)pScene->mNumMeshes;
  ppaVar12 = (aiMesh **)operator_new__(uVar29 * 8);
  pScene->mMeshes = ppaVar12;
  for (uVar13 = 0; uVar13 < uVar29; uVar13 = uVar13 + 1) {
    pScene->mMeshes[uVar13] = (aiMesh *)0x0;
    uVar29 = (ulong)pScene->mNumMeshes;
  }
  uVar23 = 0;
  local_490 = 0xffffffffffffffff;
  local_4ec = 0;
  local_478 = (Frame *)(puVar5 + (ulong)uVar10 + (ulong)uVar3 * 0x38);
  do {
    if (this->pcHeader->ulNumSurfaces <= uVar23) {
      if (pScene->mNumMeshes == 1) {
        paVar19 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar19);
        pScene->mRootNode = paVar19;
        paVar14 = *pScene->mMeshes;
        if (paVar14 != (aiMesh *)0x0) {
          if (paVar19 != (aiNode *)&paVar14->mName) {
            uVar10 = (paVar14->mName).length;
            (paVar19->mName).length = uVar10;
            memcpy((paVar19->mName).data,(paVar14->mName).data,(ulong)uVar10);
            (paVar19->mName).data[uVar10] = '\0';
          }
          paVar19->mNumMeshes = 1;
          puVar18 = (uint *)operator_new__(4);
          paVar19->mMeshes = puVar18;
          *puVar18 = 0;
        }
      }
      else {
        if (pScene->mNumMeshes == 0) {
          pDVar22 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&path,"Invalid MDC file: File contains no valid mesh",
                     (allocator<char> *)&local_4c0);
          DeadlyImportError::DeadlyImportError(pDVar22,(string *)&path);
          __cxa_throw(pDVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        paVar19 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar19);
        pScene->mRootNode = paVar19;
        uVar10 = pScene->mNumMeshes;
        paVar19->mNumChildren = uVar10;
        ppaVar20 = (aiNode **)operator_new__((ulong)uVar10 << 3);
        paVar19->mChildren = ppaVar20;
        aiString::Set((aiString *)paVar19,"<root>");
        for (uVar13 = 0; uVar13 < pScene->mNumMeshes; uVar13 = uVar13 + 1) {
          paVar19 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar19);
          pScene->mRootNode->mChildren[uVar13] = paVar19;
          paVar19->mParent = pScene->mRootNode;
          paVar14 = pScene->mMeshes[uVar13];
          if (paVar19 != (aiNode *)&paVar14->mName) {
            uVar10 = (paVar14->mName).length;
            (paVar19->mName).length = uVar10;
            memcpy((paVar19->mName).data,(paVar14->mName).data,(ulong)uVar10);
            (paVar19->mName).data[uVar10] = '\0';
          }
          paVar19->mNumMeshes = 1;
          puVar18 = (uint *)operator_new__(4);
          paVar19->mMeshes = puVar18;
          *puVar18 = (uint)uVar13;
        }
      }
      uVar13 = (ulong)((long)aszShaders.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)aszShaders.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5;
      pScene->mNumMaterials = (uint)uVar13;
      ppaVar21 = (aiMaterial **)
                 operator_new__((ulong)((long)aszShaders.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)aszShaders.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                                0x7fffffff8);
      pScene->mMaterials = ppaVar21;
      lVar28 = 8;
      for (uVar29 = 0; uVar29 < (uVar13 & 0xffffffff); uVar29 = uVar29 + 1) {
        this_01 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_01);
        pbVar7 = aszShaders.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pScene->mMaterials[uVar29] = this_01;
        iMode = 2;
        aiMaterial::AddProperty<int>(this_01,&iMode,1,"$mat.shadingm",0,0);
        local_4c0.r = 0.05;
        local_4c0.g = 0.05;
        local_4c0.b = 0.05;
        aiMaterial::AddProperty<aiColor3D>(this_01,&local_4c0,1,"$clr.ambient",0,0);
        local_4c0.b = *(ai_real *)
                       (&DAT_005da738 +
                       (ulong)(*(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar28) == 0) * 4);
        local_4c0.g = local_4c0.b;
        local_4c0.r = local_4c0.b;
        aiMaterial::AddProperty<aiColor3D>(this_01,&local_4c0,1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty<aiColor3D>(this_01,&local_4c0,1,"$clr.specular",0,0);
        if (*(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar28) != 0) {
          path._0_8_ = path._0_8_ & 0xffffff0000000000;
          memset(path.data + 1,0x1b,0x3ff);
          uVar13 = *(ulong *)((long)&(pbVar7->_M_dataplus)._M_p + lVar28);
          if (uVar13 < 0x400) {
            path.length = (ai_uint32)uVar13;
            memcpy(path.data,*(void **)((long)pbVar7 + lVar28 + -8),uVar13);
            path.data[uVar13] = '\0';
          }
          aiMaterial::AddProperty(this_01,&path,"$tex.file",1,0);
        }
        uVar13 = (ulong)pScene->mNumMaterials;
        lVar28 = lVar28 + 0x20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&aszShaders);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      (**(code **)(*local_4b0 + 8))();
      return;
    }
    if ((pSVar25->ulNumVertices != 0) && (pSVar25->ulNumTriangles != 0)) {
      paVar14 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar14);
      pScene->mMeshes[local_4ec] = paVar14;
      uVar10 = pSVar25->ulNumTriangles;
      paVar14->mNumFaces = uVar10;
      paVar14->mNumVertices = uVar10 * 3;
      sVar15 = strnlen(pSVar25->ucName,0x3f);
      path._0_8_ = path.data + 0xc;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&path,pSVar25->ucName,pSVar25->ucName + sVar15);
      uVar8 = path.data._4_8_;
      if ((ulong)path.data._4_8_ < 0x400) {
        (paVar14->mName).length = path.data._4_4_;
        memcpy((paVar14->mName).data,(void *)path._0_8_,path.data._4_8_);
        (paVar14->mName).data[uVar8] = '\0';
      }
      std::__cxx11::string::~string((string *)&path);
      if (pSVar25->ulNumShaders == 0) {
        if ((uint)local_490 == 0xffffffff) {
          uVar13 = (ulong)((long)aszShaders.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)aszShaders.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5;
          paVar14->mMaterialIndex = (uint)uVar13;
          path._0_8_ = path.data + 0xc;
          path.data[4] = '\0';
          path.data[5] = '\0';
          path.data[6] = '\0';
          path.data[7] = '\0';
          path.data[8] = '\0';
          path.data[9] = '\0';
          path.data[10] = '\0';
          path.data[0xb] = '\0';
          path.data[0xc] = '\0';
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &aszShaders,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path);
          local_490 = uVar13;
          goto LAB_004375a7;
        }
        paVar14->mMaterialIndex = (uint)local_490;
      }
      else {
        pcVar24 = pSVar25->ucName + ((ulong)pSVar25->ulOffsetShaders - 4);
        paVar14->mMaterialIndex =
             (uint)((ulong)((long)aszShaders.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)aszShaders.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5);
        sVar15 = strnlen(pcVar24,0x40);
        path._0_8_ = path.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&path,pcVar24,pcVar24 + sVar15);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&aszShaders,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path);
LAB_004375a7:
        std::__cxx11::string::~string((string *)&path);
      }
      uVar10 = paVar14->mNumVertices;
      uVar13 = (ulong)uVar10 * 0xc;
      __s = (aiVector3D *)operator_new__(uVar13);
      if (uVar10 != 0) {
        memset(__s,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
      }
      paVar14->mVertices = __s;
      __s_00 = (aiVector3D *)operator_new__(uVar13);
      if (uVar10 != 0) {
        memset(__s_00,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
      }
      paVar14->mNormals = __s_00;
      __s_01 = (aiVector3D *)operator_new__(uVar13);
      if (uVar10 != 0) {
        memset(__s_01,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
      }
      paVar14->mTextureCoords[0] = __s_01;
      uVar13 = (ulong)paVar14->mNumFaces;
      puVar16 = (ulong *)operator_new__(uVar13 * 0x10 + 8);
      *puVar16 = uVar13;
      local_4a0 = (aiFace *)(puVar16 + 1);
      if (uVar13 != 0) {
        paVar17 = local_4a0;
        do {
          paVar17->mNumIndices = 0;
          paVar17->mIndices = (uint *)0x0;
          paVar17 = paVar17 + 1;
        } while (paVar17 != local_4a0 + uVar13);
      }
      paVar14->mFaces = local_4a0;
      uVar4 = pSVar25->ulNumVertices;
      uVar13 = (ulong)this->configFrameID;
      sVar2 = *(short *)(pSVar25->ucName + uVar13 * 2 + (ulong)pSVar25->ulOffsetFrameBaseFrames + -4
                        );
      uVar10 = pSVar25->ulOffsetBaseVerts;
      bVar6 = true;
      if (uVar13 == 0) {
        local_4e0 = (char *)0x0;
      }
      else if ((pSVar25->ulNumCompFrames == 0) ||
              (*(short *)(pSVar25->ucName +
                         uVar13 * 2 + (ulong)pSVar25->ulOffsetFrameCompFrames + -4) < 0)) {
        local_4e0 = (char *)0x0;
        bVar6 = true;
      }
      else {
        local_4e0 = pSVar25->ucName +
                    (ulong)((int)*(short *)(pSVar25->ucName +
                                           uVar13 * 2 + (ulong)pSVar25->ulOffsetFrameCompFrames + -4
                                           ) * uVar4) * 4 + (ulong)pSVar25->ulOffsetCompVerts + -4;
        bVar6 = false;
      }
      local_4ec = local_4ec + 1;
      local_4a8 = pSVar25->ucName + ((ulong)pSVar25->ulOffsetTriangles - 4);
      local_480 = pSVar25->ucName + ((ulong)pSVar25->ulOffsetTexCoords - 4);
      uVar13 = 0;
      while (paVar17 = local_4a0, (uint)uVar13 < pSVar25->ulNumTriangles) {
        local_4a0->mNumIndices = 3;
        local_488 = uVar13;
        puVar18 = (uint *)operator_new__(0xc);
        uVar3 = (int)local_488 * 3;
        paVar17->mIndices = puVar18;
        lVar28 = 0;
        pcVar24 = local_4a8;
        while( true ) {
          vXYZOut = (aiVector3D *)((long)&__s->x + lVar28);
          vNorOut = (aiVector3D *)((long)&__s_00->x + lVar28);
          if (lVar28 == 0x24) break;
          uVar27 = *(uint *)pcVar24;
          if (pSVar25->ulNumVertices <= uVar27) {
            this_00 = DefaultLogger::get();
            Logger::error(this_00,"MDC vertex index is out of range");
            uVar27 = pSVar25->ulNumVertices - 1;
          }
          pFVar26 = local_478;
          uVar13 = (ulong)uVar27;
          bvert = (BaseVertex *)
                  (pSVar25->ucName +
                  uVar13 * 8 + (ulong)((int)sVar2 * uVar4 * 4) * 8 + (ulong)uVar10 + -4);
          if (bVar6) {
            *(float *)((long)&__s->x + lVar28) = (float)(int)bvert->x * 0.015625;
            *(float *)((long)&__s->y + lVar28) = (float)(int)bvert->y * 0.015625;
            *(float *)((long)&__s->z + lVar28) = (float)(int)bvert->z * 0.015625;
            MD3::LatLngNormalToVec3(bvert->normal,(ai_real *)vNorOut);
            *(undefined4 *)((long)&__s_01->x + lVar28) = *(undefined4 *)(local_480 + uVar13 * 8);
            *(float *)((long)&__s_01->y + lVar28) = 1.0 - *(float *)(local_480 + uVar13 * 8 + 4);
            pFVar26 = local_478;
          }
          else {
            MDC::BuildVertex(local_478,bvert,(CompressedVertex *)(local_4e0 + uVar13 * 4),vXYZOut,
                             vNorOut);
          }
          *(float *)((long)&__s->x + lVar28) =
               (pFVar26->localOrigin).x + *(float *)((long)&__s->x + lVar28);
          *(float *)((long)&__s->y + lVar28) =
               (pFVar26->localOrigin).y + *(float *)((long)&__s->y + lVar28);
          *(float *)((long)&__s->z + lVar28) =
               (pFVar26->localOrigin).z + *(float *)((long)&__s->z + lVar28);
          lVar28 = lVar28 + 0xc;
          pcVar24 = pcVar24 + 4;
        }
        *local_4a0->mIndices = uVar3 + 2;
        local_4a0->mIndices[1] = uVar3 + 1;
        local_4a0->mIndices[2] = uVar3;
        local_4a8 = local_4a8 + 0xc;
        local_4a0 = local_4a0 + 1;
        __s_01 = __s_01 + 3;
        __s = vXYZOut;
        __s_00 = vNorOut;
        uVar13 = (ulong)((int)local_488 + 1);
      }
      uVar13 = (ulong)pSVar25->ulOffsetEnd;
      pcVar24 = pSVar25->ucName + (uVar13 - 4);
      pcVar24[0] = '\0';
      pcVar24[1] = '\0';
      pcVar24[2] = '\0';
      pcVar24[3] = '\0';
      pcVar24 = pSVar25->ucName + uVar13 + 0x3f;
      pcVar24[0] = '\0';
      pcVar24[1] = '\0';
      pcVar24[2] = '\0';
      pcVar24[3] = '\0';
      pcVar24[4] = '\0';
      pcVar24[5] = '\0';
      pcVar24[6] = '\0';
      pcVar24[7] = '\0';
      pcVar24[8] = '\0';
      pcVar24[9] = '\0';
      pcVar24[10] = '\0';
      pcVar24[0xb] = '\0';
      pcVar24[0xc] = '\0';
      pcVar24[0xd] = '\0';
      pcVar24[0xe] = '\0';
      pcVar24[0xf] = '\0';
      pcVar24 = pSVar25->ucName + uVar13 + 0x4f;
      pcVar24[0] = '\0';
      pcVar24[1] = '\0';
      pcVar24[2] = '\0';
      pcVar24[3] = '\0';
      pcVar24[4] = '\0';
      pcVar24[5] = '\0';
      pcVar24[6] = '\0';
      pcVar24[7] = '\0';
      pcVar24[8] = '\0';
      pcVar24[9] = '\0';
      pcVar24[10] = '\0';
      pcVar24[0xb] = '\0';
      pcVar24[0xc] = '\0';
      pcVar24[0xd] = '\0';
      pcVar24[0xe] = '\0';
      pcVar24[0xf] = '\0';
      pcVar24 = pSVar25->ucName + uVar13 + 0x5f;
      pcVar24[0] = '\0';
      pcVar24[1] = '\0';
      pcVar24[2] = '\0';
      pcVar24[3] = '\0';
      pcVar24[4] = '\0';
      pcVar24[5] = '\0';
      pcVar24[6] = '\0';
      pcVar24[7] = '\0';
      pcVar24[8] = '\0';
      pcVar24[9] = '\0';
      pcVar24[10] = '\0';
      pcVar24[0xb] = '\0';
      pcVar24[0xc] = '\0';
      pcVar24[0xd] = '\0';
      pcVar24[0xe] = '\0';
      pcVar24[0xf] = '\0';
      pcVar24 = pSVar25->ucName + uVar13 + 0x68;
      pcVar24[0] = '\0';
      pcVar24[1] = '\0';
      pcVar24[2] = '\0';
      pcVar24[3] = '\0';
      pcVar24[4] = '\0';
      pcVar24[5] = '\0';
      pcVar24[6] = '\0';
      pcVar24[7] = '\0';
      pcVar24[8] = '\0';
      pcVar24[9] = '\0';
      pcVar24[10] = '\0';
      pcVar24[0xb] = '\0';
      pcVar24[0xc] = '\0';
      pcVar24[0xd] = '\0';
      pcVar24[0xe] = '\0';
      pcVar24[0xf] = '\0';
      pSVar25 = (Surface *)(pSVar25->ucName + (uVar13 - 4));
    }
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

void MDCImporter::InternReadFile(
    const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MDC file " + pFile + ".");

    // check whether the mdc file is large enough to contain the file header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MDC::Header))
        throw DeadlyImportError( "MDC File is too small.");

    std::vector<unsigned char> mBuffer2(fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    // validate the file header
    this->pcHeader = (BE_NCONST MDC::Header*)this->mBuffer;
    this->ValidateHeader();

    std::vector<std::string> aszShaders;

    // get a pointer to the frame we want to read
    BE_NCONST MDC::Frame* pcFrame = (BE_NCONST MDC::Frame*)(this->mBuffer+
        this->pcHeader->ulOffsetBorderFrames);

    // no need to swap the other members, we won't need them
    pcFrame += configFrameID;
    AI_SWAP4( pcFrame->localOrigin[0] );
    AI_SWAP4( pcFrame->localOrigin[1] );
    AI_SWAP4( pcFrame->localOrigin[2] );

    // get the number of valid surfaces
    BE_NCONST MDC::Surface* pcSurface, *pcSurface2;
    pcSurface = pcSurface2 = new (mBuffer + pcHeader->ulOffsetSurfaces) MDC::Surface;
    unsigned int iNumShaders = 0;
    for (unsigned int i = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        // validate the surface header
        this->ValidateSurfaceHeader(pcSurface2);

        if (pcSurface2->ulNumVertices && pcSurface2->ulNumTriangles)++pScene->mNumMeshes;
        iNumShaders += pcSurface2->ulNumShaders;
        pcSurface2 = new ((int8_t*)pcSurface2 + pcSurface2->ulOffsetEnd) MDC::Surface;
    }
    aszShaders.reserve(iNumShaders);
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    // necessary that we don't crash if an exception occurs
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mMeshes[i] = NULL;

    // now read all surfaces
    unsigned int iDefaultMatIndex = UINT_MAX;
    for (unsigned int i = 0, iNum = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        if (!pcSurface->ulNumVertices || !pcSurface->ulNumTriangles)continue;
        aiMesh* pcMesh = pScene->mMeshes[iNum++] = new aiMesh();

        pcMesh->mNumFaces = pcSurface->ulNumTriangles;
        pcMesh->mNumVertices = pcMesh->mNumFaces * 3;

        // store the name of the surface for use as node name.
        pcMesh->mName.Set(std::string(pcSurface->ucName
                                    , strnlen(pcSurface->ucName, AI_MDC_MAXQPATH - 1)));

        // go to the first shader in the file. ignore the others.
        if (pcSurface->ulNumShaders)
        {
            const MDC::Shader* pcShader = (const MDC::Shader*)((int8_t*)pcSurface + pcSurface->ulOffsetShaders);
            pcMesh->mMaterialIndex = (unsigned int)aszShaders.size();

            // create a new shader
            aszShaders.push_back(std::string( pcShader->ucName, 
                ::strnlen(pcShader->ucName, sizeof(pcShader->ucName)) ));
        }
        // need to create a default material
        else if (UINT_MAX == iDefaultMatIndex)
        {
            pcMesh->mMaterialIndex = iDefaultMatIndex = (unsigned int)aszShaders.size();
            aszShaders.push_back(std::string());
        }
        // otherwise assign a reference to the default material
        else pcMesh->mMaterialIndex = iDefaultMatIndex;

        // allocate output storage for the mesh
        aiVector3D* pcVertCur   = pcMesh->mVertices         = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcNorCur    = pcMesh->mNormals          = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcUVCur     = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        aiFace* pcFaceCur       = pcMesh->mFaces            = new aiFace[pcMesh->mNumFaces];

        // create all vertices/faces
        BE_NCONST MDC::Triangle* pcTriangle = (BE_NCONST MDC::Triangle*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTriangles);

        BE_NCONST MDC::TexturCoord* const pcUVs = (BE_NCONST MDC::TexturCoord*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTexCoords);

        // get a pointer to the uncompressed vertices
        int16_t iOfs = *((int16_t*) ((int8_t*) pcSurface +
            pcSurface->ulOffsetFrameBaseFrames) +  this->configFrameID);

        AI_SWAP2(iOfs);

        BE_NCONST MDC::BaseVertex* const pcVerts = (BE_NCONST MDC::BaseVertex*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetBaseVerts) +
            ((int)iOfs * pcSurface->ulNumVertices * 4);

        // do the main swapping stuff ...
#if (defined AI_BUILD_BIG_ENDIAN)

        // swap all triangles
        for (unsigned int i = 0; i < pcSurface->ulNumTriangles;++i)
        {
            AI_SWAP4( pcTriangle[i].aiIndices[0] );
            AI_SWAP4( pcTriangle[i].aiIndices[1] );
            AI_SWAP4( pcTriangle[i].aiIndices[2] );
        }

        // swap all vertices
        for (unsigned int i = 0; i < pcSurface->ulNumVertices*pcSurface->ulNumBaseFrames;++i)
        {
            AI_SWAP2( pcVerts->normal );
            AI_SWAP2( pcVerts->x );
            AI_SWAP2( pcVerts->y );
            AI_SWAP2( pcVerts->z );
        }

        // swap all texture coordinates
        for (unsigned int i = 0; i < pcSurface->ulNumVertices;++i)
        {
            AI_SWAP4( pcUVs->u );
            AI_SWAP4( pcUVs->v );
        }

#endif

        const MDC::CompressedVertex* pcCVerts = NULL;
        int16_t* mdcCompVert = NULL;

        // access compressed frames for large frame numbers, but never for the first
        if( this->configFrameID && pcSurface->ulNumCompFrames > 0 )
        {
            mdcCompVert = (int16_t*) ((int8_t*)pcSurface+pcSurface->ulOffsetFrameCompFrames) + this->configFrameID;
            AI_SWAP2P(mdcCompVert);
            if( *mdcCompVert >= 0 )
            {
                pcCVerts = (const MDC::CompressedVertex*)((int8_t*)pcSurface +
                    pcSurface->ulOffsetCompVerts) + *mdcCompVert * pcSurface->ulNumVertices;
            }
            else mdcCompVert = NULL;
        }

        // copy all faces
        for (unsigned int iFace = 0; iFace < pcSurface->ulNumTriangles;++iFace,
            ++pcTriangle,++pcFaceCur)
        {
            const unsigned int iOutIndex = iFace*3;
            pcFaceCur->mNumIndices = 3;
            pcFaceCur->mIndices = new unsigned int[3];

            for (unsigned int iIndex = 0; iIndex < 3;++iIndex,
                ++pcVertCur,++pcUVCur,++pcNorCur)
            {
                uint32_t quak = pcTriangle->aiIndices[iIndex];
                if (quak >= pcSurface->ulNumVertices)
                {
                    ASSIMP_LOG_ERROR("MDC vertex index is out of range");
                    quak = pcSurface->ulNumVertices-1;
                }

                // compressed vertices?
                if (mdcCompVert)
                {
                    MDC::BuildVertex(*pcFrame,pcVerts[quak],pcCVerts[quak],
                        *pcVertCur,*pcNorCur);
                }
                else
                {
                    // copy position
                    pcVertCur->x = pcVerts[quak].x * AI_MDC_BASE_SCALING;
                    pcVertCur->y = pcVerts[quak].y * AI_MDC_BASE_SCALING;
                    pcVertCur->z = pcVerts[quak].z * AI_MDC_BASE_SCALING;

                    // copy normals
                    MD3::LatLngNormalToVec3( pcVerts[quak].normal, &pcNorCur->x );

                    // copy texture coordinates
                    pcUVCur->x = pcUVs[quak].u;
                    pcUVCur->y = ai_real( 1.0 )-pcUVs[quak].v; // DX to OGL
                }
                pcVertCur->x += pcFrame->localOrigin[0] ;
                pcVertCur->y += pcFrame->localOrigin[1] ;
                pcVertCur->z += pcFrame->localOrigin[2] ;
            }

            // swap the face order - DX to OGL
            pcFaceCur->mIndices[0] = iOutIndex + 2;
            pcFaceCur->mIndices[1] = iOutIndex + 1;
            pcFaceCur->mIndices[2] = iOutIndex + 0;
        }

        pcSurface =  new ((int8_t*)pcSurface + pcSurface->ulOffsetEnd) MDC::Surface;
    }

    // create a flat node graph with a root node and one child for each surface
    if (!pScene->mNumMeshes)
        throw DeadlyImportError( "Invalid MDC file: File contains no valid mesh");
    else if (1 == pScene->mNumMeshes)
    {
        pScene->mRootNode = new aiNode();
        if ( nullptr != pScene->mMeshes[0] ) {
            pScene->mRootNode->mName = pScene->mMeshes[0]->mName;
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
    }
    else
    {
        pScene->mRootNode = new aiNode();
        pScene->mRootNode->mNumChildren = pScene->mNumMeshes;
        pScene->mRootNode->mChildren = new aiNode*[pScene->mNumMeshes];
        pScene->mRootNode->mName.Set("<root>");
        for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        {
            aiNode* pcNode = pScene->mRootNode->mChildren[i] = new aiNode();
            pcNode->mParent = pScene->mRootNode;
            pcNode->mName = pScene->mMeshes[i]->mName;
            pcNode->mNumMeshes = 1;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
        }
    }

    // create materials
    pScene->mNumMaterials = (unsigned int)aszShaders.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[i] = pcMat;

        const std::string& name = aszShaders[i];

        int iMode = (int)aiShadingMode_Gouraud;
        pcMat->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // add a small ambient color value - RtCW seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        if (name.length())clr.b = clr.g = clr.r = 1.0f;
        else clr.b = clr.g = clr.r = 0.6f;

        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        if (name.length())
        {
            aiString path;
            path.Set(name);
            pcMat->AddProperty(&path,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }
}